

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O1

void __thiscall
libtorrent::mmap_disk_io::add_completed_jobs_impl
          (mmap_disk_io *this,jobqueue_t *jobs,jobqueue_t *completed)

{
  mutex *__mutex;
  int *piVar1;
  disk_job *pdVar2;
  io_context *ioc;
  int iVar3;
  disk_job *pdVar4;
  int iVar5;
  mmap_disk_job *j;
  lock_guard<std::mutex> l;
  tailqueue<libtorrent::aux::disk_job> local_68;
  jobqueue_t local_48;
  
  local_68.m_first = (disk_job *)0x0;
  local_68.m_last = (disk_job *)0x0;
  local_68.m_size = 0;
  iVar5 = 0;
  for (pdVar2 = jobs->m_first; pdVar2 != (disk_job *)0x0;
      pdVar2 = (pdVar2->super_tailqueue_node<libtorrent::aux::disk_job>).next) {
    if (((pdVar2->flags).m_val & 2) != 0) {
      counters::inc_stats_counter
                (this->m_stats_counters,
                 *(__index_type *)
                  ((long)&(pdVar2->action).
                          super__Variant_base<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Move_assign_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Copy_assign_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Move_ctor_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Copy_ctor_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                          .
                          super__Variant_storage_alias<libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                  + 0x50) + 0xfe,-1);
    }
    pdVar4 = pdVar2[1].super_tailqueue_node<libtorrent::aux::disk_job>.next;
    if (pdVar4 != (disk_job *)0x0) {
      iVar3 = aux::disk_job_fence::job_complete((disk_job_fence *)&pdVar4->error,pdVar2,&local_68);
      iVar5 = iVar5 + iVar3;
    }
  }
  counters::inc_stats_counter(this->m_stats_counters,0xfb,(long)-iVar5);
  if (((this->m_abort)._M_base._M_i & 1U) == 0) {
    if (local_68.m_size != 0) {
      __mutex = &this->m_job_mutex;
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      iVar5 = local_68.m_size;
      pdVar4 = local_68.m_last;
      pdVar2 = local_68.m_first;
      if (iVar3 == 0) {
        local_68.m_first = (disk_job *)0x0;
        local_68.m_last = (disk_job *)0x0;
        local_68.m_size = 0;
        if (pdVar2 != (disk_job *)0x0) {
          if ((this->m_generic_threads).m_queued_jobs.m_first == (disk_job *)0x0) {
            (this->m_generic_threads).m_queued_jobs.m_first = pdVar2;
            (this->m_generic_threads).m_queued_jobs.m_last = pdVar4;
            (this->m_generic_threads).m_queued_jobs.m_size = iVar5;
          }
          else {
            (((this->m_generic_threads).m_queued_jobs.m_last)->
            super_tailqueue_node<libtorrent::aux::disk_job>).next = pdVar2;
            (this->m_generic_threads).m_queued_jobs.m_last = pdVar4;
            piVar1 = &(this->m_generic_threads).m_queued_jobs.m_size;
            *piVar1 = *piVar1 + iVar5;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar3 == 0) {
          aux::disk_io_thread_pool::submit_jobs(&this->m_generic_threads);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          goto LAB_002303ff;
        }
      }
      ::std::__throw_system_error(iVar3);
    }
  }
  else if (local_68.m_size != 0) {
    do {
      pdVar2 = ((local_68.m_first)->super_tailqueue_node<libtorrent::aux::disk_job>).next;
      if (local_68.m_first == local_68.m_last) {
        local_68.m_last = (disk_job *)0x0;
      }
      ((local_68.m_first)->super_tailqueue_node<libtorrent::aux::disk_job>).next = (disk_job *)0x0;
      local_68.m_size = local_68.m_size + -1;
      ((local_68.m_first)->ret).m_val = '\x01';
      ((local_68.m_first)->error).ec.val_ = 0x7d;
      ((local_68.m_first)->error).ec.failed_ = true;
      *(undefined3 *)&((local_68.m_first)->error).ec.field_0x5 = 0;
      ((local_68.m_first)->error).ec.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      *(undefined4 *)&((local_68.m_first)->error).field_0x10 = 0xffffff;
      pdVar4 = completed->m_last;
      if (completed->m_last == (disk_job *)0x0) {
        pdVar4 = (disk_job *)completed;
      }
      (pdVar4->super_tailqueue_node<libtorrent::aux::disk_job>).next = local_68.m_first;
      completed->m_last = local_68.m_first;
      ((local_68.m_first)->super_tailqueue_node<libtorrent::aux::disk_job>).next = (disk_job *)0x0;
      completed->m_size = completed->m_size + 1;
      local_68.m_first = pdVar2;
    } while (local_68.m_size != 0);
    local_68.m_size = 0;
  }
LAB_002303ff:
  ioc = this->m_ios;
  local_48.m_first = jobs->m_first;
  local_48.m_last = jobs->m_last;
  local_48.m_size = jobs->m_size;
  jobs->m_first = (disk_job *)0x0;
  jobs->m_last = (disk_job *)0x0;
  jobs->m_size = 0;
  aux::disk_completed_queue::append(&this->m_completed_jobs,ioc,&local_48);
  return;
}

Assistant:

void mmap_disk_io::add_completed_jobs_impl(jobqueue_t jobs, jobqueue_t& completed)
	{
		jobqueue_t new_jobs;
		int ret = 0;
		for (auto i = jobs.iterate(); i.get(); i.next())
		{
			auto* j = static_cast<aux::mmap_disk_job*>(i.get());
			TORRENT_ASSERT((j->flags & aux::disk_job::in_progress) || !j->storage);

			if (j->flags & aux::disk_job::fence)
			{
				m_stats_counters.inc_stats_counter(
					counters::num_fenced_read + static_cast<int>(j->get_type()), -1);
			}

			TORRENT_ASSERT(j->storage);
			if (j->storage)
				ret += j->storage->job_complete(j, new_jobs);

			TORRENT_ASSERT(ret == new_jobs.size());
			TORRENT_ASSERT(!(j->flags & aux::disk_job::in_progress));
#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(j->job_posted == false);
			j->job_posted = true;
#endif
		}

		if (ret)
		{
			DLOG("unblocked %d jobs (%d left)\n", ret
				, int(m_stats_counters[counters::blocked_disk_jobs]) - ret);
		}

		m_stats_counters.inc_stats_counter(counters::blocked_disk_jobs, -ret);
		TORRENT_ASSERT(int(m_stats_counters[counters::blocked_disk_jobs]) >= 0);

		if (m_abort.load())
		{
			while (!new_jobs.empty())
			{
				auto* j = static_cast<aux::mmap_disk_job*>(new_jobs.pop_front());
				TORRENT_ASSERT((j->flags & aux::disk_job::in_progress) || !j->storage);
				j->ret = disk_status::fatal_disk_error;
				j->error = storage_error(boost::asio::error::operation_aborted);
				completed.push_back(j);
			}
		}
		else
		{
			if (!new_jobs.empty())
			{
				{
					std::lock_guard<std::mutex> l(m_job_mutex);
					m_generic_threads.append(std::move(new_jobs));
				}

				{
					std::lock_guard<std::mutex> l(m_job_mutex);
					m_generic_threads.submit_jobs();
				}
			}
		}

		m_completed_jobs.append(m_ios, std::move(jobs));
	}